

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall Js::InterpreterStackFrame::GetRootObject(InterpreterStackFrame *this)

{
  RootObjectBase *value;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RootObjectBase *pRVar4;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x44) & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2173,"(!this->GetFunctionBody()->IsJsBuiltInCode())",
                                "!this->GetFunctionBody()->IsJsBuiltInCode()");
    if (!bVar2) goto LAB_00a54860;
    *puVar3 = 0;
  }
  value = *(RootObjectBase **)(this + 0x168);
  ValidateRegValue(this,value,false,true);
  pRVar4 = FunctionBody::LoadRootObject(*(FunctionBody **)(this + 0x88));
  if (value != pRVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2175,"(rootObject == this->GetFunctionBody()->LoadRootObject())",
                                "rootObject == this->GetFunctionBody()->LoadRootObject()");
    if (!bVar2) {
LAB_00a54860:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return value;
}

Assistant:

Var InterpreterStackFrame::GetRootObject() const
    {
        Assert(!this->GetFunctionBody()->IsJsBuiltInCode());
        Var rootObject = GetReg(Js::FunctionBody::RootObjectRegSlot);
        Assert(rootObject == this->GetFunctionBody()->LoadRootObject());
        return rootObject;
    }